

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_quad_rule.cc
# Opt level: O3

QuadRule * lf::quad::make_TriaQR_MidpointRule(void)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  QuadRule *in_RDI;
  MatrixXd points;
  VectorXd weights;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_68;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_48;
  VectorXd local_38;
  MatrixXd local_28;
  
  local_68.m_storage.m_data = (double *)0x0;
  local_68.m_storage.m_rows = 0;
  local_68.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize(&local_68,2,1);
  local_48.m_storage.m_data = (double *)0x0;
  local_48.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_48,1);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,0,0)
  ;
  *pSVar1 = (Scalar)&DAT_3fd5555555555555;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_68,1,0)
  ;
  *pSVar1 = (Scalar)&DAT_3fd5555555555555;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_48,0);
  *pSVar2 = 0.5;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_68.m_storage.m_data;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_68.m_storage.m_rows;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       local_68.m_storage.m_cols;
  local_68.m_storage.m_data = (double *)0x0;
  local_68.m_storage.m_rows = 0;
  local_68.m_storage.m_cols = 0;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       local_48.m_storage.m_data;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       local_48.m_storage.m_rows;
  local_48.m_storage.m_data = (double *)0x0;
  local_48.m_storage.m_rows = 0;
  QuadRule::QuadRule(in_RDI,(RefEl)0x3,&local_28,&local_38,1);
  free(local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_48.m_storage.m_data);
  free(local_68.m_storage.m_data);
  return in_RDI;
}

Assistant:

QuadRule make_TriaQR_MidpointRule() {
  Eigen::MatrixXd points(2, 1);
  Eigen::VectorXd weights(1);

  points(0, 0) = 1.0 / 3.0;
  points(1, 0) = 1.0 / 3.0;

  weights(0) = 0.5;

  return QuadRule(base::RefEl::kTria(), std::move(points), std::move(weights),
                  1);
}